

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAttributeImpl.h
# Opt level: O2

void __thiscall irr::io::CIntAttribute::CIntAttribute(CIntAttribute *this,char *name,s32 value)

{
  *(undefined8 *)&(this->super_IAttribute).field_0x38 = 0;
  *(undefined4 *)&this->field_0x40 = 1;
  (this->super_IAttribute).Name.str._M_dataplus._M_p =
       (pointer)&(this->super_IAttribute).Name.str.field_2;
  (this->super_IAttribute).Name.str._M_string_length = 0;
  (this->super_IAttribute).Name.str.field_2._M_local_buf[0] = '\0';
  (this->super_IAttribute)._vptr_IAttribute = (_func_int **)0x287e18;
  *(undefined8 *)&(this->super_IAttribute).field_0x30 = 0x287e78;
  core::string<char>::operator=(&(this->super_IAttribute).Name,name);
  (*(this->super_IAttribute)._vptr_IAttribute[5])(this,(ulong)(uint)value);
  return;
}

Assistant:

CIntAttribute(const char *name, s32 value)
	{
		Name = name;
		setInt(value);
	}